

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O3

int plane_mixer_info(mixed_segment_info *info,mixed_segment *segment)

{
  info->name = "plane_mixer";
  info->description = "Mixes multiple sources while simulating a 2D plane.";
  info->flags = MIXED_MODIFIES_INPUT;
  info->min_inputs = 0;
  info->max_inputs = 0xffffffff;
  info->outputs = 2;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,3,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The volume scaling factor for the output.");
  set_info_field(info->fields + 2,0x2a,9,2,MIXED_GET|MIXED_SET|MIXED_SEGMENT|MIXED_IN,
                 "The location of the source or segment (listener) in plane.");
  set_info_field(info->fields + 3,0x2b,9,2,MIXED_GET|MIXED_SET|MIXED_SEGMENT|MIXED_IN,
                 "The velocity of the source or segment (listener) in plane.");
  set_info_field(info->fields + 4,0x10,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The speed of sound. This also implicitly declares the unit size.");
  set_info_field(info->fields + 5,0x11,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The doppler factor. You can use this to exaggerate or dampen the effect.");
  set_info_field(info->fields + 6,0x12,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Any distance lower than this will make the sound appear at its maximal volume.");
  set_info_field(info->fields + 7,0x13,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Any distance greater than this will make the sound appear at its minimal volume.")
  ;
  set_info_field(info->fields + 8,0x14,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "This factor influences the curve of the attenuation function.");
  set_info_field(info->fields + 9,0x15,MIXED_FUNCTION,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The function that calculates the attenuation curve that defines the volume of a source by its distance."
                );
  clear_info_field(info->fields + 10);
  return 1;
}

Assistant:

int plane_mixer_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  
  info->name = "plane_mixer";
  info->description = "Mixes multiple sources while simulating a 2D plane.";
  info->flags = MIXED_MODIFIES_INPUT;
  info->min_inputs = 0;
  info->max_inputs = -1;
  info->outputs = 2;
    
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_VOLUME,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The volume scaling factor for the output.");

  set_info_field(field++, MIXED_PLANE_LOCATION,
                 MIXED_FLOAT, 2, MIXED_IN | MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The location of the source or segment (listener) in plane.");

  set_info_field(field++, MIXED_PLANE_VELOCITY,
                 MIXED_FLOAT, 2, MIXED_IN | MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The velocity of the source or segment (listener) in plane.");

  set_info_field(field++, MIXED_SPACE_SOUNDSPEED,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The speed of sound. This also implicitly declares the unit size.");

  set_info_field(field++, MIXED_SPACE_DOPPLER_FACTOR,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The doppler factor. You can use this to exaggerate or dampen the effect.");

  set_info_field(field++, MIXED_SPACE_MIN_DISTANCE,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Any distance lower than this will make the sound appear at its maximal volume.");

  set_info_field(field++, MIXED_SPACE_MAX_DISTANCE,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Any distance greater than this will make the sound appear at its minimal volume.");

  set_info_field(field++, MIXED_SPACE_ROLLOFF,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "This factor influences the curve of the attenuation function.");

  set_info_field(field++, MIXED_SPACE_ATTENUATION,
                 MIXED_FUNCTION, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The function that calculates the attenuation curve that defines the volume of a source by its distance.");

  clear_info_field(field++);
  return 1;
}